

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unzip.cc
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  long in_RSI;
  int in_EDI;
  int i;
  int rv;
  string *in_stack_000002e0;
  allocator local_39;
  string local_38 [32];
  int local_18;
  int local_14;
  long local_10;
  int local_8;
  undefined4 local_4;
  
  local_4 = 0;
  local_14 = 0;
  local_18 = 1;
  local_10 = in_RSI;
  local_8 = in_EDI;
  while( true ) {
    if (local_8 <= local_18) {
      return local_14;
    }
    pcVar1 = *(char **)(local_10 + (long)local_18 * 8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,pcVar1,&local_39);
    local_14 = unzip(in_stack_000002e0);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    if (local_14 != 0) break;
    local_18 = local_18 + 1;
  }
  return local_14;
}

Assistant:

int main(int argc, char** argv) {
  int rv = 0;
  for (int i = 1; i < argc; i++) {
    rv = unzip(argv[i]);
    if (rv != 0) {
      return rv;
    }
  }
  return rv;
}